

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O0

reentrant_put_transaction<void> *
density_tests::detail::
PutTestObject<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>,_256UL,_128UL>
::reentrant_put(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                *i_queue,EasyRandom *param_2)

{
  sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
  *in_RSI;
  reentrant_put_transaction<void> *in_RDI;
  reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_> transaction;
  TestObject<256UL,_128UL> local_200;
  reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_> local_e8;
  reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_> local_c8 [6];
  
  TestObject<256UL,_128UL>::TestObject(&local_200);
  density::
  sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::start_reentrant_push<density_tests::TestObject<256ul,128ul>>(&local_e8,in_RSI,&local_200);
  density::
  sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::reentrant_put_transaction<density_tests::TestObject<256ul,128ul>>::
  reentrant_put_transaction<density_tests::TestObject<256ul,128ul>,void>
            ((reentrant_put_transaction<density_tests::TestObject<256ul,128ul>> *)local_c8,&local_e8
            );
  density::
  sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_>::~reentrant_put_transaction
            (&local_e8);
  TestObject<256UL,_128UL>::~TestObject(&local_200);
  exception_checkpoint();
  density::
  sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::reentrant_put_transaction<void>::
  reentrant_put_transaction<density_tests::TestObject<256ul,128ul>,void>
            ((reentrant_put_transaction<void> *)in_RDI,local_c8);
  density::
  sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_>::~reentrant_put_transaction
            (local_c8);
  return in_RDI;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                auto transaction = i_queue.start_reentrant_push(ElementType());
                exception_checkpoint();
                return std::move(transaction);
            }